

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

bool __thiscall Network::createQualModel(Network *this)

{
  pointer pcVar1;
  int iVar2;
  QualModel *pQVar3;
  SystemError *this_00;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  if (this->qualModel != (QualModel *)0x0) {
    (*this->qualModel->_vptr_QualModel[1])();
  }
  pcVar1 = (this->options).stringOptions[0xb]._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + (this->options).stringOptions[0xb]._M_string_length)
  ;
  iVar2 = std::__cxx11::string::compare((char *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (iVar2 == 0) {
    this->qualModel = (QualModel *)0x0;
  }
  else {
    pcVar1 = (this->options).stringOptions[0xb]._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,
               pcVar1 + (this->options).stringOptions[0xb]._M_string_length);
    pQVar3 = QualModel::factory(&local_48);
    this->qualModel = pQVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (this->qualModel == (QualModel *)0x0) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x30);
      SystemError::SystemError(this_00,5);
      __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
    }
  }
  return true;
}

Assistant:

bool Network::createQualModel()
{
    if ( qualModel ) delete qualModel;
    if (option(Options::QUAL_MODEL) == "NONE")
    {
        qualModel = nullptr;
        return true;
    }
    qualModel = QualModel::factory(option(Options::QUAL_MODEL));
    if ( qualModel == nullptr )
    {
        throw SystemError(SystemError::QUALITY_MODEL_NOT_OPENED);
    }
	return true;
}